

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O2

void anon_unknown.dwarf_3b63a::rejectBStringMixedCase(string *bstring)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  bool bVar2;
  bool bVar3;
  runtime_error *this;
  
  _Var1._M_current = (bstring->_M_dataplus)._M_p;
  bVar2 = std::
          any_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,int(*)(int)noexcept>
                    (_Var1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(_Var1._M_current + bstring->_M_string_length),isupper);
  _Var1._M_current = (bstring->_M_dataplus)._M_p;
  bVar3 = std::
          any_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,int(*)(int)noexcept>
                    (_Var1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(_Var1._M_current + bstring->_M_string_length),islower);
  if ((bVar2) && (bVar3)) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"bech32 string is mixed case");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void rejectBStringMixedCase(const std::string &bstring) {
        bool atLeastOneUpper = std::any_of(bstring.begin(), bstring.end(), &::isupper);
        bool atLeastOneLower = std::any_of(bstring.begin(), bstring.end(), &::islower);
        if(atLeastOneUpper && atLeastOneLower) {
            throw std::runtime_error("bech32 string is mixed case");
        }
    }